

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panic.c
# Opt level: O1

void nni_show_backtrace(void)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  undefined1 local_1b8 [8];
  void *frames [50];
  
  uVar1 = backtrace(local_1b8,0x32);
  if (1 < (int)uVar1) {
    lVar2 = backtrace_symbols(local_1b8,uVar1);
    if (lVar2 != 0) {
      uVar3 = 1;
      do {
        nni_plat_printf("%s\n",*(undefined8 *)(lVar2 + uVar3 * 8));
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return;
}

Assistant:

void
nni_show_backtrace(void)
{
#ifdef NNG_HAVE_BACKTRACE
	void *frames[50];
	int   nframes;

	nframes = backtrace(frames, sizeof(frames) / sizeof(frames[0]));
	if (nframes > 1) {
		char **lines = backtrace_symbols(frames, nframes);
		if (lines == NULL) {
			return;
		}
		for (int i = 1; i < nframes; i++) {
			nni_println(lines[i]);
		}
	}
#endif
}